

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeCapsule *a_capsule,
                 ON_RTreeSearchResultCallback *a_result)

{
  bool bVar1;
  double dVar2;
  int local_58;
  int local_54;
  ON_RTreeBranch *local_50;
  ON_RTreeBranch *branch;
  double r [2];
  int local_30;
  int local_2c;
  int count;
  int i;
  ON_RTreeSearchResultCallback *a_result_local;
  ON_RTreeCapsule *a_capsule_local;
  ON_RTreeNode *a_node_local;
  
  local_30 = a_node->m_count;
  if (0 < local_30) {
    local_50 = a_node->m_branch;
    bVar1 = ON_RTreeNode::IsInternalNode(a_node);
    if (bVar1) {
      if (1 < local_30) {
        dVar2 = DistanceToCapsuleAxisHelper(a_capsule,&local_50->m_rect);
        r[0] = DistanceToCapsuleAxisHelper(a_capsule,&local_50[local_30 + -1].m_rect);
        if (r[0] < dVar2) {
          local_54 = local_30 + -1;
        }
        else {
          local_54 = 0;
        }
        if (((r[(long)(int)(uint)(local_54 != 0) + -1] <= a_capsule->m_radius) &&
            (bVar1 = SearchHelper(local_50[local_54].field_1.m_child,a_capsule,a_result), !bVar1))
           || ((r[(long)(int)(uint)(local_54 == 0) + -1] <= a_capsule->m_radius &&
               (bVar1 = SearchHelper(local_50[(local_30 + -1) - local_54].field_1.m_child,a_capsule,
                                     a_result), !bVar1)))) {
          return false;
        }
        local_30 = local_30 + -2;
        local_50 = a_node->m_branch + 1;
      }
      r[0] = a_capsule->m_radius;
      for (local_2c = 0; local_2c < local_30; local_2c = local_2c + 1) {
        dVar2 = DistanceToCapsuleAxisHelper(a_capsule,&local_50[local_2c].m_rect);
        if (dVar2 <= r[0]) {
          bVar1 = SearchHelper(local_50[local_2c].field_1.m_child,a_capsule,a_result);
          if (!bVar1) {
            return false;
          }
          r[0] = a_capsule->m_radius;
        }
      }
    }
    else {
      if (1 < local_30) {
        dVar2 = DistanceToCapsuleAxisHelper(a_capsule,&local_50->m_rect);
        r[0] = DistanceToCapsuleAxisHelper(a_capsule,&local_50[local_30 + -1].m_rect);
        if (r[0] < dVar2) {
          local_58 = local_30 + -1;
        }
        else {
          local_58 = 0;
        }
        if (((r[(long)(int)(uint)(local_58 != 0) + -1] <= a_capsule->m_radius) &&
            (bVar1 = (*a_result->m_resultCallback)
                               (a_result->m_context,local_50[local_58].field_1.m_id), !bVar1)) ||
           ((r[(long)(int)(uint)(local_58 == 0) + -1] <= a_capsule->m_radius &&
            (bVar1 = (*a_result->m_resultCallback)
                               (a_result->m_context,
                                local_50[(local_30 + -1) - local_58].field_1.m_id), !bVar1)))) {
          return false;
        }
        local_30 = local_30 + -2;
        local_50 = a_node->m_branch + 1;
      }
      r[0] = a_capsule->m_radius;
      for (local_2c = 0; local_2c < local_30; local_2c = local_2c + 1) {
        dVar2 = DistanceToCapsuleAxisHelper(a_capsule,&local_50[local_2c].m_rect);
        if (dVar2 <= r[0]) {
          bVar1 = (*a_result->m_resultCallback)(a_result->m_context,local_50[local_2c].field_1.m_id)
          ;
          if (!bVar1) {
            return false;
          }
          r[0] = a_capsule->m_radius;
        }
      }
    }
  }
  return true;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, struct ON_RTreeCapsule* a_capsule, ON_RTreeSearchResultCallback& a_result ) 
{
  // NOTE: 
  //  Some versions of ON_RTree::Search shrink a_sphere as the search progresses.
  int i, count;
  double r[2];
  
  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      if ( count > 1 )
      {
        // search a closer node first to avoid worst case search times
        // in closest point style calculations
        r[0] = DistanceToCapsuleAxisHelper( a_capsule, &branch[0].m_rect );
        r[1] = DistanceToCapsuleAxisHelper( a_capsule, &branch[count-1].m_rect );
        i = ( r[0] <= r[1] ) ? 0 : count-1;
        if (    (r[i?1:0] <= a_capsule->m_radius && !SearchHelper(branch[i].m_child, a_capsule, a_result)) 
             || (r[i?0:1] <= a_capsule->m_radius && !SearchHelper(branch[count-1 - i].m_child, a_capsule, a_result))
          )
        {
          // callback canceled search
          return false;
        }
        count -= 2;
        branch++;
      }

      r[1] = a_capsule->m_radius;
      for( i = 0; i < count; ++i )
      {
        r[0] = DistanceToCapsuleAxisHelper(a_capsule, &branch[i].m_rect);
        if(r[0] <= r[1])
        {
          if(!SearchHelper(branch[i].m_child, a_capsule, a_result) )
          {
            return false; // Don't continue searching
          }
          // a_result.m_resultCallback can shrink the capsule
          r[1] = a_capsule->m_radius;
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      if ( count > 1 )
      {
        // search a closer node first to avoid worst case search times
        // in closest point style calculations
        r[0] = DistanceToCapsuleAxisHelper( a_capsule, &branch[0].m_rect );
        r[1] = DistanceToCapsuleAxisHelper( a_capsule, &branch[count-1].m_rect );
        i = ( r[0] <= r[1] ) ? 0 : count-1;
        if (    (r[i?1:0] <= a_capsule->m_radius && !a_result.m_resultCallback( a_result.m_context, branch[i].m_id )) 
             || (r[i?0:1] <= a_capsule->m_radius && !a_result.m_resultCallback( a_result.m_context, branch[count-1 - i].m_id ))
          )
        {
          // callback canceled search
          return false;
        }
        count -= 2;
        branch++;
      }

      r[1] = a_capsule->m_radius;
      for( i = 0; i < count; ++i)
      {
        r[0] = DistanceToCapsuleAxisHelper(a_capsule, &branch[i].m_rect);
        if(r[0] <= r[1])
        {
          if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
          {
            // callback canceled search
            return false;
          }
          // a_result.m_resultCallback can shrink the capsule
          r[1] = a_capsule->m_radius;
        }
      }
    }
  }

  return true; // Continue searching
}